

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O0

st__table * st__copy(st__table *old_table)

{
  int iVar1;
  st__table_entry **ppsVar2;
  st__table_entry *psVar3;
  int local_48;
  int num_bins;
  int j;
  int i;
  st__table_entry *newEntry;
  st__table_entry *next;
  st__table_entry *newEntryptr;
  st__table_entry *ptr;
  st__table *newEntry_table;
  st__table *old_table_local;
  
  iVar1 = old_table->num_bins;
  old_table_local = (st__table *)malloc(0x30);
  if (old_table_local == (st__table *)0x0) {
    old_table_local = (st__table *)0x0;
  }
  else {
    memcpy(old_table_local,old_table,0x30);
    ppsVar2 = (st__table_entry **)malloc((long)iVar1 << 3);
    old_table_local->bins = ppsVar2;
    if (old_table_local->bins == (st__table_entry **)0x0) {
      if (old_table_local != (st__table *)0x0) {
        free(old_table_local);
      }
      old_table_local = (st__table *)0x0;
    }
    else {
      for (num_bins = 0; num_bins < iVar1; num_bins = num_bins + 1) {
        old_table_local->bins[num_bins] = (st__table_entry *)0x0;
        for (newEntryptr = old_table->bins[num_bins]; newEntryptr != (st__table_entry *)0x0;
            newEntryptr = newEntryptr->next) {
          psVar3 = (st__table_entry *)malloc(0x18);
          if (psVar3 == (st__table_entry *)0x0) {
            for (local_48 = 0; local_48 <= num_bins; local_48 = local_48 + 1) {
              psVar3 = old_table_local->bins[local_48];
              while (next = psVar3, next != (st__table_entry *)0x0) {
                psVar3 = next->next;
                if (next != (st__table_entry *)0x0) {
                  free(next);
                }
              }
            }
            if (old_table_local->bins != (st__table_entry **)0x0) {
              free(old_table_local->bins);
              old_table_local->bins = (st__table_entry **)0x0;
            }
            if (old_table_local != (st__table *)0x0) {
              free(old_table_local);
            }
            return (st__table *)0x0;
          }
          psVar3->key = newEntryptr->key;
          psVar3->record = newEntryptr->record;
          psVar3->next = newEntryptr->next;
          psVar3->next = old_table_local->bins[num_bins];
          old_table_local->bins[num_bins] = psVar3;
        }
      }
    }
  }
  return old_table_local;
}

Assistant:

st__table *
 st__copy( st__table *old_table)
{
    st__table *newEntry_table;
    st__table_entry *ptr, *newEntryptr, *next, *newEntry;
    int i, j, num_bins = old_table->num_bins;

    newEntry_table = ABC_ALLOC( st__table, 1);
    if (newEntry_table == NULL) {
    return NULL;
    }
    
    *newEntry_table = *old_table;
    newEntry_table->bins = ABC_ALLOC( st__table_entry *, num_bins);
    if (newEntry_table->bins == NULL) {
    ABC_FREE(newEntry_table);
    return NULL;
    }
    for(i = 0; i < num_bins ; i++) {
    newEntry_table->bins[i] = NULL;
    ptr = old_table->bins[i];
    while (ptr != NULL) {
        newEntry = ABC_ALLOC( st__table_entry, 1);
        if (newEntry == NULL) {
        for (j = 0; j <= i; j++) {
            newEntryptr = newEntry_table->bins[j];
            while (newEntryptr != NULL) {
            next = newEntryptr->next;
            ABC_FREE(newEntryptr);
            newEntryptr = next;
            }
        }
        ABC_FREE(newEntry_table->bins);
        ABC_FREE(newEntry_table);
        return NULL;
        }
        *newEntry = *ptr;
        newEntry->next = newEntry_table->bins[i];
        newEntry_table->bins[i] = newEntry;
        ptr = ptr->next;
    }
    }
    return newEntry_table;
}